

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyInsertNodeBeforeElement(Node *element,Node *node)

{
  Node *pNVar1;
  
  pNVar1 = element->parent;
  node->parent = pNVar1;
  node->next = element;
  node->prev = element->prev;
  element->prev = node;
  if (node->prev != (Node *)0x0) {
    node->prev->next = node;
  }
  if (pNVar1->content != element) {
    return;
  }
  pNVar1->content = node;
  return;
}

Assistant:

void TY_(InsertNodeBeforeElement)(Node *element, Node *node)
{
    Node *parent;

    parent = element->parent;
    node->parent = parent;
    node->next = element;
    node->prev = element->prev;
    element->prev = node;

    if (node->prev)
        node->prev->next = node;

    if (parent->content == element)
        parent->content = node;
}